

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O3

bool __thiscall
stream::inno_lzma1_decompressor_impl::filter
          (inno_lzma1_decompressor_impl *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  lzma_stream *plVar5;
  string *psVar6;
  char cVar7;
  byte bVar8;
  lzma_options_lzma options;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  lzma_options_lzma local_a0;
  
  if ((this->super_lzma_decompressor_impl_base).stream == (void *)0x0) {
    while (sVar3 = this->nread, sVar3 != 5) {
      pcVar2 = *begin_in;
      if (pcVar2 == end_in) {
        return true;
      }
      *begin_in = pcVar2 + 1;
      cVar7 = *pcVar2;
      this->nread = sVar3 + 1;
      this->header[sVar3] = cVar7;
    }
    bVar1 = this->header[0];
    if (0xe1 < bVar1) {
      psVar6 = (string *)__cxa_allocate_exception(0x28);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>((string *)local_c0,"inno lzma1 property error","");
      std::ios_base::failure[abi:cxx11]::failure(psVar6);
      *(undefined ***)psVar6 = &PTR__failure_00172700;
      *(undefined4 *)(psVar6 + 0x20) = 7;
      __cxa_throw(psVar6,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    cVar7 = (char)((uint)bVar1 * 0x6d >> 8);
    bVar8 = (byte)(((byte)(bVar1 - cVar7) >> 1) + cVar7) >> 5;
    local_a0.pb = (uint32_t)bVar8;
    local_a0.lp = (byte)(bVar1 + bVar8 * -0x2d) / 9;
    local_a0.lc = (uint32_t)(bVar1 % 9);
    local_a0.dict_size = *(uint32_t *)(this->header + 1);
    plVar5 = init_raw_lzma_stream(0x4000000000000001,&local_a0);
    (this->super_lzma_decompressor_impl_base).stream = plVar5;
  }
  bVar4 = lzma_decompressor_impl_base::filter
                    (&this->super_lzma_decompressor_impl_base,begin_in,end_in,begin_out,end_out,
                     flush);
  return bVar4;
}

Assistant:

bool inno_lzma1_decompressor_impl::filter(const char * & begin_in, const char * end_in,
                                          char * & begin_out, char * end_out, bool flush) {
	
	// Decode the header.
	if(!stream) {
		
		// Read enough bytes to decode the header.
		while(nread != 5) {
			if(begin_in == end_in) {
				return true;
			}
			header[nread++] = *begin_in++;
		}
		
		lzma_options_lzma options;
		
		boost::uint8_t properties = boost::uint8_t(header[0]);
		if(properties > (9 * 5 * 5)) {
			throw lzma_error("inno lzma1 property error", LZMA_FORMAT_ERROR);
		}
		options.pb = boost::uint32_t(properties / (9 * 5));
		options.lp = boost::uint32_t((properties % (9 * 5)) / 9);
		options.lc = boost::uint32_t(properties % 9);
		
		options.dict_size = util::little_endian::load<boost::uint32_t>(header + 1);
		
		stream = init_raw_lzma_stream(LZMA_FILTER_LZMA1, options);
	}
	
	return lzma_decompressor_impl_base::filter(begin_in, end_in, begin_out, end_out, flush);
}